

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteStandard<double,duckdb::interval_t,duckdb::UnaryOperatorWrapper,duckdb::ToMilliSecondsOperator>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  interval_t *piVar2;
  double *pdVar3;
  unsigned_long *puVar4;
  SelectionVector *sel_vector;
  VectorBuffer *pVVar5;
  idx_t iVar6;
  interval_t iVar7;
  optional_idx dict_size;
  UnifiedVectorFormat local_78;
  
  VVar1 = input->vector_type;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    piVar2 = (interval_t *)result->data;
    pdVar3 = (double *)input->data;
    FlatVector::VerifyFlatVector(input);
    FlatVector::VerifyFlatVector(result);
    ExecuteFlat<double,duckdb::interval_t,duckdb::UnaryOperatorWrapper,duckdb::ToMilliSecondsOperator>
              (pdVar3,piVar2,count,&input->validity,&result->validity,dataptr,adds_nulls);
  }
  else {
    if (VVar1 == DICTIONARY_VECTOR) {
      if (errors == CANNOT_ERROR) {
        DictionaryVector::VerifyDictionary(input);
        pVVar5 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&input->buffer);
        local_78.sel = (SelectionVector *)pVVar5[1].data.allocator.ptr;
        if (((Allocator *)local_78.sel != (Allocator *)0xffffffffffffffff) &&
           (iVar6 = optional_idx::GetIndex((optional_idx *)&local_78), iVar6 * 2 <= count)) {
          DictionaryVector::VerifyDictionary(input);
          pVVar5 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&input->auxiliary);
          if (*(char *)&pVVar5[1]._vptr_VectorBuffer == '\0') {
            piVar2 = (interval_t *)result->data;
            pdVar3 = (double *)pVVar5[1].data.pointer;
            iVar6 = optional_idx::GetIndex((optional_idx *)&local_78);
            FlatVector::VerifyFlatVector((Vector *)(pVVar5 + 1));
            FlatVector::VerifyFlatVector(result);
            ExecuteFlat<double,duckdb::interval_t,duckdb::UnaryOperatorWrapper,duckdb::ToMilliSecondsOperator>
                      (pdVar3,piVar2,iVar6,(ValidityMask *)&pVVar5[1].data.allocated_size,
                       &result->validity,dataptr,adds_nulls);
            DictionaryVector::VerifyDictionary(input);
            pVVar5 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&input->buffer);
            iVar6 = optional_idx::GetIndex((optional_idx *)&local_78);
            Vector::Dictionary(result,result,iVar6,(SelectionVector *)(pVVar5 + 1),count);
            return;
          }
        }
      }
    }
    else if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      piVar2 = (interval_t *)result->data;
      pdVar3 = (double *)input->data;
      puVar4 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      iVar7 = ToMilliSecondsOperator::Operation<double,duckdb::interval_t>(*pdVar3);
      *piVar2 = iVar7;
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    sel_vector = local_78.sel;
    piVar2 = (interval_t *)result->data;
    FlatVector::VerifyFlatVector(result);
    ExecuteLoop<double,duckdb::interval_t,duckdb::UnaryOperatorWrapper,duckdb::ToMilliSecondsOperator>
              ((double *)local_78.data,piVar2,count,sel_vector,&local_78.validity,&result->validity,
               dataptr,adds_nulls);
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}